

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv__nonblock(int fd,int set)

{
  int iVar1;
  int *piVar2;
  int in_EDI;
  bool bVar3;
  int r;
  undefined1 local_c [4];
  int local_8;
  int local_4;
  
  local_8 = in_EDI;
  do {
    iVar1 = ioctl(local_8,0x5421,local_c);
    bVar3 = false;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    piVar2 = __errno_location();
    local_4 = -*piVar2;
  }
  return local_4;
}

Assistant:

int uv__nonblock(int fd, int set) {
  int r;

  do
    r = ioctl(fd, FIONBIO, &set);
  while (r == -1 && errno == EINTR);

  if (r)
    return -errno;

  return 0;
}